

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cost_sensitive.cc
# Opt level: O1

void COST_SENSITIVE::output_example(vw *all,example *ec)

{
  int iVar1;
  wclass *pwVar2;
  int *piVar3;
  namedlabels *pnVar4;
  pointer psVar5;
  _func_void_int_string_v_array<char> *p_Var6;
  v_array<char> vVar7;
  v_array<char> vVar8;
  float fVar9;
  wclass *__begin2;
  wclass *pwVar10;
  ostream *poVar11;
  wclass *__end2;
  bool bVar12;
  ulong uVar13;
  long lVar14;
  ulong uVar15;
  char *pcVar16;
  uint uVar17;
  undefined8 uVar18;
  ulong uVar19;
  int *piVar20;
  float fVar21;
  float fVar22;
  stringstream outputStringStream;
  undefined7 in_stack_fffffffffffffde8;
  char in_stack_fffffffffffffdef;
  undefined4 uVar23;
  float in_stack_fffffffffffffdf8;
  undefined4 in_stack_fffffffffffffdfc;
  v_array<char> *pvVar24;
  vw *pvVar25;
  undefined1 *local_1f8 [2];
  undefined1 local_1e8 [16];
  undefined1 *local_1d8;
  undefined1 local_1c8 [16];
  stringstream local_1b8 [16];
  undefined1 local_1a8 [376];
  
  pwVar10 = (ec->l).cs.costs._begin;
  pwVar2 = (ec->l).cs.costs._end;
  fVar21 = 0.0;
  if ((long)pwVar2 - (long)pwVar10 != 0) {
    if ((pwVar10->x == 3.4028235e+38) && (!NAN(pwVar10->x))) {
      uVar13 = (long)pwVar2 - (long)pwVar10 >> 4;
      uVar15 = 1;
      do {
        uVar19 = uVar15;
        if (uVar13 <= uVar19) goto LAB_00249f2e;
      } while ((pwVar10[uVar19].x == 3.4028235e+38) &&
              (uVar15 = (ulong)((int)uVar19 + 1), !NAN(pwVar10[uVar19].x)));
      if (uVar13 <= uVar19) goto LAB_00249f2e;
    }
    if (pwVar10 == pwVar2) {
      fVar22 = 3.4028235e+38;
      fVar21 = 3.4028235e+38;
    }
    else {
      fVar21 = 3.4028235e+38;
      fVar22 = 3.4028235e+38;
      do {
        if (pwVar10->class_index == (ec->pred).multiclass) {
          fVar21 = pwVar10->x;
        }
        fVar9 = pwVar10->x;
        if (fVar22 <= pwVar10->x) {
          fVar9 = fVar22;
        }
        fVar22 = fVar9;
        pwVar10 = pwVar10 + 1;
      } while (pwVar10 != pwVar2);
    }
    if ((fVar21 == 3.4028235e+38) && (!NAN(fVar21))) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,
                 "warning: csoaa predicted an invalid class. Are all multi-class labels in the {1..k} range?"
                 ,0x5a);
      std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x10);
      std::ostream::put(-0x10);
      std::ostream::flush();
      in_stack_fffffffffffffdf8 = fVar22;
    }
    fVar21 = (fVar21 - fVar22) * ec->weight;
  }
LAB_00249f2e:
  pwVar10 = (ec->l).cs.costs._begin;
  lVar14 = (long)(ec->l).cs.costs._end - (long)pwVar10;
  if (lVar14 == 0) {
    bVar12 = false;
  }
  else {
    bVar12 = true;
    if ((pwVar10->x == 3.4028235e+38) && (!NAN(pwVar10->x))) {
      uVar15 = lVar14 >> 4;
      uVar17 = 1;
      while( true ) {
        uVar13 = (ulong)uVar17;
        bVar12 = uVar13 < uVar15;
        if (uVar15 <= uVar13) break;
        uVar17 = uVar17 + 1;
        if ((pwVar10[uVar13].x != 3.4028235e+38) || (NAN(pwVar10[uVar13].x))) break;
      }
    }
  }
  pvVar25 = all;
  shared_data::update(all->sd,ec->test_only,bVar12,fVar21,ec->weight,ec->num_features);
  pvVar24 = (v_array<char> *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8);
  piVar20 = (all->final_prediction_sink)._begin;
  piVar3 = (all->final_prediction_sink)._end;
  fVar21 = SUB84(piVar3,0);
  uVar23 = (undefined4)((ulong)piVar3 >> 0x20);
  if (piVar20 != piVar3) {
    pvVar24 = &ec->tag;
    do {
      iVar1 = *piVar20;
      pnVar4 = all->sd->ldict;
      if (pnVar4 == (namedlabels *)0x0) {
        (*all->print)(iVar1,(float)(ec->pred).multiclass,0.0,*pvVar24);
      }
      else {
        uVar17 = (ec->pred).multiclass - 1;
        pcVar16 = (char *)0x0;
        uVar18 = 0;
        if (uVar17 < pnVar4->K) {
          psVar5 = (pnVar4->id2name).super__Vector_base<substring,_std::allocator<substring>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          uVar18 = psVar5[uVar17].begin;
          pcVar16 = psVar5[uVar17].end;
        }
        p_Var6 = all->print_text;
        local_1f8[0] = local_1e8;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_1f8,uVar18,pcVar16);
        vVar7._begin._7_1_ = in_stack_fffffffffffffdef;
        vVar7._begin._0_7_ = in_stack_fffffffffffffde8;
        vVar7._end._0_4_ = fVar21;
        vVar7._end._4_4_ = uVar23;
        vVar7.end_array._0_4_ = (int)pvVar24;
        vVar7.end_array._4_4_ = (int)((ulong)pvVar24 >> 0x20);
        vVar7.erase_count = (size_t)pvVar25;
        all = pvVar25;
        (*p_Var6)(iVar1,(string)*pvVar24,vVar7);
        pvVar25 = all;
        if (local_1f8[0] != local_1e8) {
          operator_delete(local_1f8[0]);
        }
      }
      piVar20 = piVar20 + 1;
    } while (piVar20 != (int *)CONCAT44(uVar23,fVar21));
  }
  if (0 < all->raw_prediction) {
    std::__cxx11::stringstream::stringstream(local_1b8);
    pwVar10 = (ec->l).cs.costs._begin;
    all = pvVar25;
    if ((ec->l).cs.costs._end != pwVar10) {
      uVar17 = 1;
      uVar15 = 0;
      do {
        fVar21 = pwVar10[uVar15].partial_prediction;
        if (uVar17 != 1) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,&stack0xfffffffffffffdef,1);
        }
        poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
        in_stack_fffffffffffffdef = ':';
        std::__ostream_insert<char,std::char_traits<char>>(poVar11,&stack0xfffffffffffffdef,1);
        std::ostream::_M_insert<double>((double)fVar21);
        uVar15 = (ulong)uVar17;
        pwVar10 = (ec->l).cs.costs._begin;
        uVar17 = uVar17 + 1;
      } while (uVar15 < (ulong)((long)(ec->l).cs.costs._end - (long)pwVar10 >> 4));
    }
    p_Var6 = all->print_text;
    iVar1 = all->raw_prediction;
    pvVar25 = all;
    std::__cxx11::stringbuf::str();
    vVar8._begin._7_1_ = in_stack_fffffffffffffdef;
    vVar8._begin._0_7_ = in_stack_fffffffffffffde8;
    vVar8._end._0_4_ = fVar21;
    vVar8._end._4_4_ = uVar23;
    vVar8.end_array._0_4_ = (int)pvVar24;
    vVar8.end_array._4_4_ = (int)((ulong)pvVar24 >> 0x20);
    vVar8.erase_count = (size_t)pvVar25;
    (*p_Var6)(iVar1,(string)ec->tag,vVar8);
    if (local_1d8 != local_1c8) {
      operator_delete(local_1d8);
    }
    std::__cxx11::stringstream::~stringstream(local_1b8);
    std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  }
  pwVar10 = (ec->l).cs.costs._begin;
  lVar14 = (long)(ec->l).cs.costs._end - (long)pwVar10;
  if (lVar14 == 0) {
    bVar12 = true;
  }
  else if ((pwVar10->x != 3.4028235e+38) || (NAN(pwVar10->x))) {
    bVar12 = false;
  }
  else {
    uVar15 = lVar14 >> 4;
    uVar17 = 1;
    while( true ) {
      uVar13 = (ulong)uVar17;
      bVar12 = uVar15 <= uVar13;
      if (uVar15 <= uVar13) break;
      uVar17 = uVar17 + 1;
      if ((pwVar10[uVar13].x != 3.4028235e+38) || (NAN(pwVar10[uVar13].x))) break;
    }
  }
  print_update(all,bVar12,ec,(multi_ex *)0x0,false,(ec->pred).multiclass);
  return;
}

Assistant:

void output_example(vw& all, example& ec)
{
  label& ld = ec.l.cs;

  float loss = 0.;
  if (!test_label(&ld))
  {
    // need to compute exact loss
    size_t pred = (size_t)ec.pred.multiclass;

    float chosen_loss = FLT_MAX;
    float min = FLT_MAX;
    for (auto& cl : ld.costs)
    {
      if (cl.class_index == pred)
        chosen_loss = cl.x;
      if (cl.x < min)
        min = cl.x;
    }
    if (chosen_loss == FLT_MAX)
      cerr << "warning: csoaa predicted an invalid class. Are all multi-class labels in the {1..k} range?" << endl;

    loss = (chosen_loss - min) * ec.weight;
    // TODO(alberto): add option somewhere to allow using absolute loss instead?
    // loss = chosen_loss;
  }

  all.sd->update(ec.test_only, !test_label(&ld), loss, ec.weight, ec.num_features);

  for (int sink : all.final_prediction_sink)
    if (!all.sd->ldict)
      all.print(sink, (float)ec.pred.multiclass, 0, ec.tag);
    else
    {
      substring ss_pred = all.sd->ldict->get(ec.pred.multiclass);
      all.print_text(sink, string(ss_pred.begin, ss_pred.end - ss_pred.begin), ec.tag);
    }

  if (all.raw_prediction > 0)
  {
    stringstream outputStringStream;
    for (unsigned int i = 0; i < ld.costs.size(); i++)
    {
      wclass cl = ld.costs[i];
      if (i > 0)
        outputStringStream << ' ';
      outputStringStream << cl.class_index << ':' << cl.partial_prediction;
    }
    all.print_text(all.raw_prediction, outputStringStream.str(), ec.tag);
  }

  print_update(all, test_label(&ec.l.cs), ec, nullptr, false, ec.pred.multiclass);
}